

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hacdRaycastMesh.cpp
# Opt level: O2

void __thiscall HACD::RaycastMesh::ComputeBB(RaycastMesh *this)

{
  double dVar1;
  Vec3<double> *pVVar2;
  size_t sVar3;
  double *pdVar4;
  BBox *pBVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  
  sVar3 = this->m_nVertices;
  if (sVar3 != 0) {
    pVVar2 = this->m_vertices;
    dVar6 = pVVar2->m_data[0];
    (this->m_bBox).m_min.m_data[0] = dVar6;
    dVar8 = pVVar2->m_data[1];
    (this->m_bBox).m_min.m_data[1] = dVar8;
    dVar10 = pVVar2->m_data[2];
    (this->m_bBox).m_min.m_data[2] = dVar10;
    dVar11 = pVVar2->m_data[0];
    (this->m_bBox).m_max.m_data[0] = dVar11;
    dVar12 = pVVar2->m_data[1];
    (this->m_bBox).m_max.m_data[1] = dVar12;
    dVar13 = pVVar2->m_data[2];
    pdVar4 = pVVar2[1].m_data + 2;
    (this->m_bBox).m_max.m_data[2] = dVar13;
    while (sVar3 = sVar3 - 1, sVar3 != 0) {
      dVar14 = ((Vec3<double> *)(pdVar4 + -2))->m_data[0];
      dVar9 = pdVar4[-1];
      dVar1 = *pdVar4;
      pBVar5 = &this->m_bBox;
      dVar7 = dVar14;
      dVar15 = dVar11;
      if ((dVar14 < dVar6) ||
         (pBVar5 = (BBox *)&(this->m_bBox).m_max, dVar7 = dVar6, dVar15 = dVar14, dVar11 < dVar14))
      {
        (pBVar5->m_min).m_data[0] = dVar14;
        dVar11 = dVar15;
        dVar6 = dVar7;
      }
      dVar14 = dVar12;
      dVar7 = dVar9;
      pVVar2 = &(this->m_bBox).m_min;
      if ((dVar9 < dVar8) ||
         (dVar14 = dVar9, dVar7 = dVar8, pVVar2 = &(this->m_bBox).m_max, dVar12 < dVar9)) {
        pVVar2->m_data[1] = dVar9;
        dVar12 = dVar14;
        dVar8 = dVar7;
      }
      dVar14 = dVar13;
      dVar9 = dVar1;
      pVVar2 = &(this->m_bBox).m_min;
      if ((dVar1 < dVar10) ||
         (dVar14 = dVar1, dVar9 = dVar10, pVVar2 = &(this->m_bBox).m_max, dVar13 < dVar1)) {
        pVVar2->m_data[2] = dVar1;
        dVar13 = dVar14;
        dVar10 = dVar9;
      }
      pdVar4 = pdVar4 + 3;
    }
  }
  return;
}

Assistant:

void RaycastMesh::ComputeBB()
	{
		if (m_nVertices == 0)
		{
			return;
		}
		m_bBox.m_min = m_vertices[0];
		m_bBox.m_max = m_vertices[0];
		Float x, y, z;
        for (size_t v = 1; v < m_nVertices ; v++) 
        {
            x = m_vertices[v].X();
            y = m_vertices[v].Y();
            z = m_vertices[v].Z();
            if ( x < m_bBox.m_min.X()) m_bBox.m_min.X() = x;
			else if ( x > m_bBox.m_max.X()) m_bBox.m_max.X() = x;
            if ( y < m_bBox.m_min.Y()) m_bBox.m_min.Y() = y;
			else if ( y > m_bBox.m_max.Y()) m_bBox.m_max.Y() = y;
            if ( z < m_bBox.m_min.Z()) m_bBox.m_min.Z() = z;
			else if ( z > m_bBox.m_max.Z()) m_bBox.m_max.Z() = z;
        }
	}